

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createTestQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,VkImageViewType viewType)

{
  ulong uVar1;
  reference pvVar2;
  float *pfVar3;
  size_type sVar4;
  float local_10c;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_f0;
  int aiStack_d8 [2];
  int faceArrayIndices [6];
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_b8;
  ulong local_a0;
  size_t vertexNdx_1;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_80;
  ulong local_68;
  size_t vertexNdx;
  size_t quadNdx;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_30;
  undefined1 local_15;
  VkImageViewType local_14;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *pvStack_10;
  VkImageViewType viewType_local;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  local_15 = 0;
  local_14 = viewType;
  pvStack_10 = __return_storage_ptr__;
  std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::vector
            (__return_storage_ptr__);
  switch(local_14) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_2D:
    createFullscreenQuad();
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,&local_30);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              (&local_30);
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    createQuadMosaic((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      *)&vertexNdx_1,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,
               (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
               &vertexNdx_1);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              ((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
               &vertexNdx_1);
    for (local_a0 = 0; uVar1 = local_a0,
        sVar4 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                ::size(__return_storage_ptr__), uVar1 < sVar4; local_a0 = local_a0 + 1) {
      pvVar2 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_a0);
      pfVar3 = tcu::Vector<float,_4>::z(&pvVar2->texCoord);
      *pfVar3 = *pfVar3 / 5.0;
      pvVar2 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_a0);
      pfVar3 = tcu::Vector<float,_4>::z(&pvVar2->texCoord);
      *pfVar3 = *pfVar3 - 0.001;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    createQuadMosaicCube();
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,&local_b8);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              (&local_b8);
    break;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    createQuadMosaic((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      *)&quadNdx,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,
               (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
               &quadNdx);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              ((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
               &quadNdx);
    for (vertexNdx = 0; vertexNdx < 6; vertexNdx = vertexNdx + 1) {
      for (local_68 = 0; local_68 < 6; local_68 = local_68 + 1) {
        local_10c = (float)vertexNdx;
        pvVar2 = std::
                 vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
                 operator[](__return_storage_ptr__,local_68 + vertexNdx * 6);
        pfVar3 = tcu::Vector<float,_4>::y(&pvVar2->texCoord);
        *pfVar3 = local_10c;
      }
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    createQuadMosaic(&local_80,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,&local_80);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              (&local_80);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    aiStack_d8[0] = 0;
    aiStack_d8[1] = 1;
    faceArrayIndices[0] = 2;
    faceArrayIndices[1] = 3;
    faceArrayIndices[2] = 4;
    faceArrayIndices[3] = 5;
    createQuadMosaicCubeArray(&local_f0,aiStack_d8);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::operator=
              (__return_storage_ptr__,&local_f0);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
              (&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createTestQuadMosaic (vk::VkImageViewType viewType)
{
	std::vector<Vertex4Tex4> vertices;

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
			vertices = createFullscreenQuad();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			vertices = createQuadMosaic(2, 3);

			// Set up array indices
			for (size_t quadNdx = 0; quadNdx < 6; quadNdx++)
				for (size_t vertexNdx = 0; vertexNdx < 6; vertexNdx++)
					vertices[quadNdx * 6 + vertexNdx].texCoord.y() = (float)quadNdx;

			break;

		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			vertices = createQuadMosaic(2, 3);
			break;

		case vk::VK_IMAGE_VIEW_TYPE_3D:
			vertices = createQuadMosaic(2, 3);

			// Use z between 0.0 and 1.0.
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
			{
				vertices[vertexNdx].texCoord.z() /= 5.0f;
				vertices[vertexNdx].texCoord.z() -= 0.001f; // Substract small value to correct floating-point errors at the boundaries between slices
			}

			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
			vertices = createQuadMosaicCube();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			{
				int faceArrayIndices[6] = { 0, 1, 2, 3, 4, 5 };
				vertices = createQuadMosaicCubeArray(faceArrayIndices);
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return vertices;
}